

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ClearColorImage
          (VulkanCommandBuffer *this,VkImage Image,VkClearColorValue *Color,
          VkImageSubresourceRange *Subresource)

{
  string msg;
  string local_48;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Subresource);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ClearColorImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->m_State).RenderPass != (VkRenderPass)0x0) ||
     ((this->m_State).DynamicRenderingHash != 0)) {
    Diligent::FormatString<char[166]>
              (&local_48,
               (char (*) [166])
               "vkCmdClearColorImage() must be called outside of render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-renderpass)"
              );
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ClearColorImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (Subresource->aspectMask != 1) {
    Diligent::FormatString<char[202]>
              (&local_48,
               (char (*) [202])
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_COLOR_BIT (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-aspectMask-02498)"
              );
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ClearColorImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x3b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  FlushBarriers(this);
  (*vkCmdClearColorImage)
            (this->m_VkCmdBuffer,Image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,Color,1,Subresource);
  return;
}

Assistant:

__forceinline void ClearColorImage(VkImage                        Image,
                                       const VkClearColorValue&       Color,
                                       const VkImageSubresourceRange& Subresource)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(!IsInRenderScope(),
               "vkCmdClearColorImage() must be called outside of render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-renderpass)");
        VERIFY(Subresource.aspectMask == VK_IMAGE_ASPECT_COLOR_BIT,
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_COLOR_BIT "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearColorImage-aspectMask-02498)");

        FlushBarriers();
        vkCmdClearColorImage(
            m_VkCmdBuffer,
            Image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, // must be VK_IMAGE_LAYOUT_GENERAL or VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
            &Color,
            1,
            &Subresource);
    }